

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofRAngle.cpp
# Opt level: O0

void __thiscall OpenMD::GofRAngle::processOverlapping(GofRAngle *this,SelectionManager *sman)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  SelectionManager *in_RDI;
  int k;
  int j;
  int i;
  StuntDouble *sd3;
  StuntDouble *sd2;
  StuntDouble *sd1;
  pointer *in_stack_ffffffffffffff88;
  SelectionManager *in_stack_ffffffffffffff90;
  RadialDistrFunc *in_stack_ffffffffffffffa0;
  SelectionEvaluator *in_stack_ffffffffffffffb8;
  StuntDouble *local_28;
  StuntDouble *local_20;
  StuntDouble *local_18;
  
  if (((ulong)in_RDI[0x14].stuntdoubles_.
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start & 1) == 0) {
    RadialDistrFunc::processOverlapping(in_stack_ffffffffffffffa0,in_RDI);
  }
  else {
    bVar1 = SelectionEvaluator::isDynamic
                      ((SelectionEvaluator *)
                       &in_RDI[0x15].bonds_.
                        super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    if (bVar1) {
      in_stack_ffffffffffffff88 =
           &in_RDI[0x14].bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
      in_stack_ffffffffffffff90 = (SelectionManager *)&stack0xffffffffffffffb0;
      SelectionEvaluator::evaluate(in_stack_ffffffffffffffb8);
      SelectionManager::setSelectionSet
                (in_stack_ffffffffffffff90,(SelectionSet *)in_stack_ffffffffffffff88);
      SelectionSet::~SelectionSet((SelectionSet *)0x14f879);
    }
    iVar2 = SelectionManager::getSelectionCount((SelectionManager *)0x14f8a2);
    iVar3 = SelectionManager::getSelectionCount((SelectionManager *)0x14f8b7);
    if (iVar2 != iVar3) {
      RadialDistrFunc::processOverlapping(in_stack_ffffffffffffffa0,in_RDI);
    }
    local_18 = SelectionManager::beginSelected
                         (in_stack_ffffffffffffff90,(int *)in_stack_ffffffffffffff88);
    local_28 = SelectionManager::beginSelected
                         (in_stack_ffffffffffffff90,(int *)in_stack_ffffffffffffff88);
    while (local_18 != (StuntDouble *)0x0 && local_28 != (StuntDouble *)0x0) {
      local_20 = SelectionManager::nextSelected
                           (in_stack_ffffffffffffff90,(int *)in_stack_ffffffffffffff88);
      while (local_20 != (StuntDouble *)0x0) {
        (**(code **)&in_RDI->info_->nGlobalTorsions_)(in_RDI,local_18,local_20,local_28);
        local_20 = SelectionManager::nextSelected
                             (in_stack_ffffffffffffff90,(int *)in_stack_ffffffffffffff88);
      }
      local_18 = SelectionManager::nextSelected
                           (in_stack_ffffffffffffff90,(int *)in_stack_ffffffffffffff88);
      local_28 = SelectionManager::nextSelected
                           (in_stack_ffffffffffffff90,(int *)in_stack_ffffffffffffff88);
    }
  }
  return;
}

Assistant:

void GofRAngle::processOverlapping(SelectionManager& sman) {
    StuntDouble* sd1;
    StuntDouble* sd2;
    StuntDouble* sd3;
    int i;
    int j;
    int k;

    // This is the same as a pairwise loop structure:
    // for (int i = 0;  i < n-1 ; ++i ) {
    //   for (int j = i + 1; j < n; ++j) {}
    // }

    if (doSele3_) {
      if (evaluator3_.isDynamic()) {
        seleMan3_.setSelectionSet(evaluator3_.evaluate());
      }
      if (sman.getSelectionCount() != seleMan3_.getSelectionCount()) {
        RadialDistrFunc::processOverlapping(sman);
      }
      for (sd1 = sman.beginSelected(i), sd3 = seleMan3_.beginSelected(k);
           sd1 != NULL && sd3 != NULL;
           sd1 = sman.nextSelected(i), sd3 = seleMan3_.nextSelected(k)) {
        for (j = i, sd2 = sman.nextSelected(j); sd2 != NULL;
             sd2 = sman.nextSelected(j)) {
          collectHistogram(sd1, sd2, sd3);
        }
      }
    } else {
      RadialDistrFunc::processOverlapping(sman);
    }
  }